

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCompactProtocol.h
# Opt level: O0

shared_ptr<duckdb_apache::thrift::protocol::TProtocol> __thiscall
duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::MyTransport>::getProtocol
          (TCompactProtocolFactoryT<duckdb::MyTransport> *this,
          shared_ptr<duckdb_apache::thrift::transport::TTransport> *trans)

{
  bool bVar1;
  void *pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::MyTransport> *in_RSI;
  element_type *in_RDI;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> sVar3;
  TProtocol *prot;
  shared_ptr<duckdb::MyTransport> specific_trans;
  TProtocol *in_stack_ffffffffffffff48;
  shared_ptr<duckdb::MyTransport> *in_stack_ffffffffffffff50;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar4;
  shared_ptr<duckdb::MyTransport> local_68;
  undefined1 local_51;
  void *local_30;
  __shared_ptr local_28 [40];
  
  std::static_pointer_cast<duckdb::MyTransport,duckdb_apache::thrift::transport::TTransport>
            (in_stack_ffffffffffffff58);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
  if (bVar1) {
    pvVar2 = operator_new(0xb0);
    local_51 = 1;
    std::shared_ptr<duckdb::MyTransport>::shared_ptr
              (in_stack_ffffffffffffff50,
               (shared_ptr<duckdb::MyTransport> *)in_stack_ffffffffffffff48);
    TCompactProtocolT<duckdb::MyTransport>::TCompactProtocolT
              ((TCompactProtocolT<duckdb::MyTransport> *)
               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_RSI,
               (int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
    local_51 = 0;
    local_30 = pvVar2;
    std::shared_ptr<duckdb::MyTransport>::~shared_ptr((shared_ptr<duckdb::MyTransport> *)0x220853e);
  }
  else {
    pvVar2 = operator_new(0xb0);
    uVar4 = 1;
    in_stack_ffffffffffffff50 = &local_68;
    std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::shared_ptr
              ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)in_stack_ffffffffffffff50
               ,(shared_ptr<duckdb_apache::thrift::transport::TTransport> *)
                in_stack_ffffffffffffff48);
    TCompactProtocolT<duckdb_apache::thrift::transport::TTransport>::TCompactProtocolT
              ((TCompactProtocolT<duckdb_apache::thrift::transport::TTransport> *)
               CONCAT17(uVar4,in_stack_ffffffffffffff90),
               (shared_ptr<duckdb_apache::thrift::transport::TTransport> *)in_RSI,
               (int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
    local_30 = pvVar2;
    std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x22085ee);
  }
  std::shared_ptr<duckdb_apache::thrift::protocol::TProtocol>::
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol,void>
            ((shared_ptr<duckdb_apache::thrift::protocol::TProtocol> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::shared_ptr<duckdb::MyTransport>::~shared_ptr((shared_ptr<duckdb::MyTransport> *)0x2208641);
  sVar3.super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<duckdb_apache::thrift::protocol::TProtocol>)
         sVar3.
         super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TProtocol> getProtocol(std::shared_ptr<TTransport> trans) override {
    std::shared_ptr<Transport_> specific_trans = std::static_pointer_cast<Transport_>(trans);
    TProtocol* prot;
    if (specific_trans) {
      prot = new TCompactProtocolT<Transport_>(specific_trans, string_limit_, container_limit_);
    } else {
      prot = new TCompactProtocol(trans, string_limit_, container_limit_);
    }

    return std::shared_ptr<TProtocol>(prot);
  }